

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.cpp
# Opt level: O3

void __thiscall BVFixed::CopyBits(BVFixed *this,BVFixed *bv,BVIndex i)

{
  code *pcVar1;
  sbyte sVar2;
  bool bVar3;
  BOOLEAN BVar4;
  BOOLEAN BVar5;
  BVIndex BVar6;
  BVIndex BVar7;
  undefined4 *puVar8;
  int iVar9;
  BVIndex BVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  
  AssertBV(this,bv);
  uVar12 = i >> 6;
  uVar13 = (ulong)uVar12;
  BVar6 = WordCount(bv->len);
  BVar7 = WordCount(this->len);
  BVar10 = BVar6 - uVar12;
  if (BVar7 < BVar6 - uVar12) {
    BVar10 = BVar7;
  }
  if ((i & 0x3f) == 0) {
    js_memcpy_s(this + 1,(ulong)(BVar10 << 3),bv + (ulong)uVar12 + 1,(ulong)(BVar10 << 3));
  }
  else if (BVar6 != uVar12) {
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    sVar2 = (sbyte)(i & 0x3f);
    uVar11 = 0;
    do {
      BVar6 = WordCount(bv->len);
      if ((ulong)BVar6 <= uVar13 + uVar11) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVector.cpp"
                           ,0x10d,"(pos < bv->WordCount())","pos < bv->WordCount()");
        if (!bVar3) goto LAB_00690aa3;
        *puVar8 = 0;
      }
      this[uVar11 + 1] = (BVFixed)((ulong)bv[uVar13 + uVar11 + 1] >> sVar2);
      BVar6 = WordCount(bv->len);
      if ((ulong)BVar6 <= uVar13 + uVar11 + 1) break;
      this[uVar11 + 1] =
           (BVFixed)((ulong)this[uVar11 + 1] |
                    (long)bv[uVar13 + uVar11 + 2] << (0x40U - sVar2 & 0x3f));
      uVar11 = uVar11 + 1;
    } while (BVar10 + (BVar10 == 0) != uVar11);
  }
  if (i < this->len + i) {
    BVar10 = 0;
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      BVar4 = Test(this,BVar10);
      BVar5 = Test(bv,i + BVar10);
      if (BVar4 != BVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVector.cpp"
                           ,0x11e,"(this->Test(curr - i) == bv->Test(curr))",
                           "this->Test(curr - i) == bv->Test(curr)");
        if (!bVar3) {
LAB_00690aa3:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar8 = 0;
      }
      iVar9 = i + BVar10;
      BVar10 = BVar10 + 1;
    } while (iVar9 + 1U < this->len + i);
  }
  return;
}

Assistant:

void
BVFixed::CopyBits(const BVFixed * bv, BVIndex i)
{
    AssertBV(bv);
    BVIndex offset = BVUnit::Offset(i);
    BVIndex position = BVUnit::Position(i);
    BVIndex len = bv->WordCount() - position;
    BVIndex copylen = min(WordCount(), len);
    if (offset == 0)
    {
        js_memcpy_s(&this->data[0], copylen * sizeof(BVUnit), &bv->data[BVUnit::Position(i)], copylen * sizeof(BVUnit));
    }
    else
    {
        BVIndex pos = position;
        for (BVIndex j = 0; j < copylen; j++)
        {
            Assert(pos < bv->WordCount());
            this->data[j] = bv->data[pos];
            this->data[j].ShiftRight(offset);

            pos++;
            if (pos >= bv->WordCount())
            {
                break;
            }
            BVUnit temp = bv->data[pos];
            temp.ShiftLeft(BVUnit::BitsPerWord - offset);
            this->data[j].Or(temp);
        }
    }
#if DBG
    for (BVIndex curr = i; curr < i + this->Length(); curr++)
    {
        Assert(this->Test(curr - i) == bv->Test(curr));
    }
#endif
}